

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

UniValue * SummaryToJSON(IndexSummary *summary,string *index_name)

{
  bool bVar1;
  __type_conflict _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *ret_summary;
  UniValue entry;
  UniValue *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd88;
  UniValue *pUVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  UniValue *in_stack_fffffffffffffd98;
  UniValue *val;
  UniValue *this;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  undefined1 local_20a [2];
  UniValue local_208 [4];
  UniValue local_a0;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (UniValue *)&stack0xffffffffffffffd8;
  val = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffd90);
  UniValue::UniValue(in_stack_fffffffffffffd98,(VType)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                     in_stack_fffffffffffffd88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd78);
  if ((bVar1) ||
     (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_RDI,in_RDX), ((_Var2 ^ 0xffU) & 1) == 0)) {
    pUVar3 = &local_a0;
    std::__cxx11::string::string(in_stack_fffffffffffffd90);
    UniValue::UniValue(pUVar3,(VType)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                       in_stack_fffffffffffffd88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc8,
               (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (allocator<char> *)this);
    UniValue::UniValue<const_bool_&,_bool,_true>(this,(bool *)val);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (string *)this,val);
    UniValue::~UniValue(in_stack_fffffffffffffd78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd78);
    std::allocator<char>::~allocator((allocator<char> *)(local_20a + 1));
    pUVar3 = (UniValue *)local_20a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc8,
               (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (allocator<char> *)this);
    UniValue::UniValue<const_int_&,_int,_true>(this,(int *)val);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (string *)this,val);
    UniValue::~UniValue(in_stack_fffffffffffffd78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd78);
    std::allocator<char>::~allocator((allocator<char> *)local_20a);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    UniValue::UniValue(pUVar3,local_208);
    UniValue::pushKV((UniValue *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (string *)this,val);
    UniValue::~UniValue(in_stack_fffffffffffffd78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd78);
    UniValue::~UniValue(in_stack_fffffffffffffd78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static UniValue SummaryToJSON(const IndexSummary&& summary, std::string index_name)
{
    UniValue ret_summary(UniValue::VOBJ);
    if (!index_name.empty() && index_name != summary.name) return ret_summary;

    UniValue entry(UniValue::VOBJ);
    entry.pushKV("synced", summary.synced);
    entry.pushKV("best_block_height", summary.best_block_height);
    ret_summary.pushKV(summary.name, std::move(entry));
    return ret_summary;
}